

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          align_spec *spec,str_writer<char> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  int *piVar7;
  wchar_t __tmp;
  long lVar8;
  long lVar9;
  size_t size;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  basic_buffer<wchar_t> *c;
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar15 = (ulong)spec->width_;
  uVar11 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar8 = puVar2[2];
  uVar10 = uVar15 - uVar11;
  if (uVar15 < uVar11 || uVar10 == 0) {
    uVar11 = uVar11 + lVar8;
    if ((ulong)puVar2[3] < uVar11) {
      (**(code **)*puVar2)(puVar2,uVar11);
    }
    puVar2[2] = uVar11;
    if (0 < (long)f->size_) {
      lVar12 = puVar2[1];
      pcVar13 = f->s;
      lVar6 = f->size_ + 1;
      lVar9 = 0;
      do {
        *(int *)(lVar8 * 4 + lVar12 + lVar9 * 4) = (int)pcVar13[lVar9];
        lVar6 = lVar6 + -1;
        lVar9 = lVar9 + 1;
      } while (1 < lVar6);
    }
  }
  else {
    uVar14 = lVar8 + uVar15;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
    }
    puVar2[2] = uVar14;
    auVar5 = _DAT_0015b050;
    auVar4 = _DAT_0015b040;
    auVar3 = _DAT_0015b030;
    lVar12 = puVar2[1];
    piVar7 = (int *)(lVar12 + lVar8 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar14 = uVar10 >> 1;
      if (1 < uVar10) {
        piVar7 = piVar7 + uVar14;
        uVar10 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar26._8_4_ = (int)uVar10;
        auVar26._0_8_ = uVar10;
        auVar26._12_4_ = (int)(uVar10 >> 0x20);
        lVar12 = lVar12 + lVar8 * 4;
        lVar8 = 0;
        auVar26 = auVar26 ^ _DAT_0015b050;
        do {
          auVar23._8_4_ = (int)lVar8;
          auVar23._0_8_ = lVar8;
          auVar23._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar27 = (auVar23 | auVar4) ^ auVar5;
          iVar21 = auVar26._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar21 && auVar26._0_4_ < auVar27._0_4_ ||
                      iVar21 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar12 + lVar8 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
              auVar27._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar12 + 4 + lVar8 * 4) = wVar1;
          }
          auVar23 = (auVar23 | auVar3) ^ auVar5;
          iVar28 = auVar23._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar12 + 8 + lVar8 * 4) = wVar1;
            *(wchar_t *)(lVar12 + 0xc + lVar8 * 4) = wVar1;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar10 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
      }
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        lVar8 = f->size_ + 1;
        do {
          *piVar7 = (int)*pcVar13;
          pcVar13 = pcVar13 + 1;
          piVar7 = piVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar5 = _DAT_0015b050;
      auVar4 = _DAT_0015b040;
      auVar3 = _DAT_0015b030;
      if (uVar15 != uVar11) {
        uVar10 = (uVar15 * 4 + (uVar11 + uVar14) * -4) - 4;
        auVar27._8_4_ = (int)uVar10;
        auVar27._0_8_ = uVar10;
        auVar27._12_4_ = (int)(uVar10 >> 0x20);
        auVar18._0_8_ = uVar10 >> 2;
        auVar18._8_8_ = auVar27._8_8_ >> 2;
        uVar11 = 0;
        auVar18 = auVar18 ^ _DAT_0015b050;
        do {
          auVar24._8_4_ = (int)uVar11;
          auVar24._0_8_ = uVar11;
          auVar24._12_4_ = (int)(uVar11 >> 0x20);
          auVar26 = (auVar24 | auVar4) ^ auVar5;
          iVar21 = auVar18._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar18._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            piVar7[uVar11] = wVar1;
          }
          if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
              auVar26._12_4_ <= auVar18._12_4_) {
            piVar7[uVar11 + 1] = wVar1;
          }
          auVar26 = (auVar24 | auVar3) ^ auVar5;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar18._0_4_)) {
            piVar7[uVar11 + 2] = wVar1;
            piVar7[uVar11 + 3] = wVar1;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar15 != uVar11) {
        piVar7 = piVar7 + uVar10;
        uVar10 = (uVar15 * 4 + uVar11 * -4) - 4;
        auVar16._8_4_ = (int)uVar10;
        auVar16._0_8_ = uVar10;
        auVar16._12_4_ = (int)(uVar10 >> 0x20);
        auVar17._0_8_ = uVar10 >> 2;
        auVar17._8_8_ = auVar16._8_8_ >> 2;
        lVar12 = lVar12 + lVar8 * 4;
        uVar11 = 0;
        auVar17 = auVar17 ^ _DAT_0015b050;
        do {
          auVar22._8_4_ = (int)uVar11;
          auVar22._0_8_ = uVar11;
          auVar22._12_4_ = (int)(uVar11 >> 0x20);
          auVar26 = (auVar22 | auVar4) ^ auVar5;
          iVar21 = auVar17._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar17._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            *(wchar_t *)(lVar12 + uVar11 * 4) = wVar1;
          }
          if ((auVar26._12_4_ != auVar17._12_4_ || auVar26._8_4_ <= auVar17._8_4_) &&
              auVar26._12_4_ <= auVar17._12_4_) {
            *(wchar_t *)(lVar12 + 4 + uVar11 * 4) = wVar1;
          }
          auVar26 = (auVar22 | auVar3) ^ auVar5;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar17._0_4_)) {
            *(wchar_t *)(lVar12 + 8 + uVar11 * 4) = wVar1;
            *(wchar_t *)(lVar12 + 0xc + uVar11 * 4) = wVar1;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        lVar8 = f->size_ + 1;
        lVar12 = 0;
        do {
          piVar7[lVar12] = (int)pcVar13[lVar12];
          lVar8 = lVar8 + -1;
          lVar12 = lVar12 + 1;
        } while (1 < lVar8);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        lVar8 = f->size_ + 1;
        do {
          *piVar7 = (int)*pcVar13;
          pcVar13 = pcVar13 + 1;
          piVar7 = piVar7 + 1;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      auVar5 = _DAT_0015b050;
      auVar4 = _DAT_0015b040;
      auVar3 = _DAT_0015b030;
      if (uVar15 != uVar11) {
        uVar10 = (uVar15 * 4 + uVar11 * -4) - 4;
        auVar19._8_4_ = (int)uVar10;
        auVar19._0_8_ = uVar10;
        auVar19._12_4_ = (int)(uVar10 >> 0x20);
        auVar20._0_8_ = uVar10 >> 2;
        auVar20._8_8_ = auVar19._8_8_ >> 2;
        uVar11 = 0;
        auVar20 = auVar20 ^ _DAT_0015b050;
        do {
          auVar25._8_4_ = (int)uVar11;
          auVar25._0_8_ = uVar11;
          auVar25._12_4_ = (int)(uVar11 >> 0x20);
          auVar26 = (auVar25 | auVar4) ^ auVar5;
          iVar21 = auVar20._4_4_;
          if ((bool)(~(auVar26._4_4_ == iVar21 && auVar20._0_4_ < auVar26._0_4_ ||
                      iVar21 < auVar26._4_4_) & 1)) {
            piVar7[uVar11] = wVar1;
          }
          if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
              auVar26._12_4_ <= auVar20._12_4_) {
            piVar7[uVar11 + 1] = wVar1;
          }
          auVar26 = (auVar25 | auVar3) ^ auVar5;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar20._0_4_)) {
            piVar7[uVar11 + 2] = wVar1;
            piVar7[uVar11 + 3] = wVar1;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar10 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }